

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

string * slang::setIntList<unsigned_long>
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *target,string_view name,
                   string_view value,bitmask<slang::CommandLineFlags> flags)

{
  string_view value_00;
  string_view value_01;
  string_view name_00;
  bool bVar1;
  reference pbVar2;
  _Storage<unsigned_long,_true> __x;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> *in_RSI;
  string *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  optional<unsigned_long> oVar3;
  optional<unsigned_long> result;
  basic_string_view<char,_std::char_traits<char>_> entry;
  iterator __end2;
  iterator __begin2;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  *__range2;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> splitMem;
  string *error;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  *in_stack_fffffffffffffea8;
  string *this;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *splitMem_00;
  undefined8 in_stack_fffffffffffffed0;
  undefined1 allowCommaList;
  undefined8 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  uint uVar4;
  undefined1 in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff19;
  undefined7 in_stack_ffffffffffffff20;
  byte bVar5;
  char *pcVar6;
  char *pcVar7;
  char *in_stack_ffffffffffffff38;
  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
  local_b8 [3];
  bitmask<slang::CommandLineFlags> local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> local_88
  ;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  *local_78;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> local_70;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  *local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  allowCommaList = (undefined1)((ulong)in_stack_fffffffffffffed0 >> 0x38);
  splitMem_00 = &local_70;
  this = in_RDI;
  local_38 = in_RSI;
  local_28 = in_R8;
  uStack_20 = in_R9;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL>::SmallVector
            ((SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *)0x2fedc4);
  local_98 = local_28;
  uStack_90 = uStack_20;
  bitmask<slang::CommandLineFlags>::bitmask(&local_9c,CommaList);
  bitmask<slang::CommandLineFlags>::has
            ((bitmask<slang::CommandLineFlags> *)
             CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
             (bitmask<slang::CommandLineFlags> *)in_stack_fffffffffffffe98);
  value_00._M_str._0_4_ = in_stack_fffffffffffffee0;
  value_00._M_len = in_stack_fffffffffffffed8;
  value_00._M_str._4_4_ = in_stack_fffffffffffffee4;
  local_88 = parseList(value_00,(bool)allowCommaList,splitMem_00);
  local_78 = &local_88;
  local_b8[0]._M_current =
       (basic_string_view<char,_std::char_traits<char>_> *)
       std::
       span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>::
       begin(in_stack_fffffffffffffe98);
  std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>::
  end(in_stack_fffffffffffffea8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                      ((__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                        *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                       (__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffe98);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
             ::operator*(local_b8);
    pcVar6 = (char *)pbVar2->_M_len;
    pcVar7 = pbVar2->_M_str;
    bVar5 = 0;
    std::__cxx11::string::string(this);
    name_00._M_str = in_stack_ffffffffffffff38;
    name_00._M_len = (size_t)pcVar7;
    value_01._M_len._7_1_ = bVar5;
    value_01._M_len._0_7_ = in_stack_ffffffffffffff20;
    value_01._M_str = pcVar6;
    oVar3 = parseInt<unsigned_long>
                      (name_00,value_01,
                       (string *)CONCAT71(in_stack_ffffffffffffff19,in_stack_ffffffffffffff18));
    __x._M_value = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._M_payload;
    in_stack_fffffffffffffea7 =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
    in_stack_ffffffffffffff18 = in_stack_fffffffffffffea7;
    bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x2fef26);
    if (bVar1) {
      in_stack_fffffffffffffe98 = local_38;
      std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x2fef8e);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,
                 (value_type_conflict2 *)__x);
    }
    else {
      bVar5 = 1;
    }
    uVar4 = (uint)!bVar1;
    if ((bVar5 & 1) == 0) {
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    }
    if (uVar4 != 0) goto LAB_002fefe8;
    __gnu_cxx::
    __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
    ::operator++(local_b8);
  }
  std::__cxx11::string::string(this);
LAB_002fefe8:
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL>::~SmallVector
            ((SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *)0x2feff5);
  return in_RDI;
}

Assistant:

static std::string setIntList(std::vector<T>& target, std::string_view name, std::string_view value,
                              bitmask<CommandLineFlags> flags) {
    SmallVector<std::string_view> splitMem;
    for (auto entry : parseList(value, flags.has(CommandLineFlags::CommaList), splitMem)) {
        std::string error;
        auto result = parseInt<T>(name, entry, error);
        if (!result)
            return error;

        target.push_back(*result);
    }
    return {};
}